

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbar.cpp
# Opt level: O2

int __thiscall
QtMWidgets::NavigationBar::addWidget
          (NavigationBar *this,QWidget *parent,QString *title,QWidget *widget)

{
  Type *pTVar1;
  Data *dd;
  bool bVar2;
  int iVar3;
  QSharedPointer<QtMWidgets::NavigationItem> *pQVar4;
  NavigationItem *ptr;
  QWidget *widget_local;
  QSharedPointer<QtMWidgets::NavigationItem> item;
  QWidget *parent_local;
  
  widget_local = widget;
  parent_local = parent;
  bVar2 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::contains
                    (&((this->d).d)->itemsMap,&parent_local);
  if (bVar2) {
    iVar3 = QStackedWidget::addWidget((QWidget *)((this->d).d)->stack);
    pQVar4 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                       (&((this->d).d)->itemsMap,&parent_local);
    pTVar1 = pQVar4->value;
    dd = pQVar4->d;
    if (dd != (Data *)0x0) {
      LOCK();
      (dd->weakref)._q_value.super___atomic_base<int>._M_i =
           (dd->weakref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (dd->strongref)._q_value.super___atomic_base<int>._M_i =
           (dd->strongref)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    ptr = (NavigationItem *)operator_new(0x40);
    (ptr->children).d.size = 0;
    ptr->parent = (NavigationItem *)0x0;
    (ptr->children).d.d = (Data *)0x0;
    (ptr->children).d.ptr = (QSharedPointer<QtMWidgets::NavigationItem> *)0x0;
    (ptr->title).d.size = 0;
    ptr->self = (QWidget *)0x0;
    (ptr->title).d.d = (Data *)0x0;
    (ptr->title).d.ptr = (char16_t *)0x0;
    QSharedPointer<QtMWidgets::NavigationItem>::QSharedPointer<QtMWidgets::NavigationItem,_true>
              (&item,ptr);
    QString::operator=(&(item.value)->title,(QString *)title);
    (item.value)->parent = pTVar1;
    (item.value)->self = widget_local;
    QList<QSharedPointer<QtMWidgets::NavigationItem>>::
    emplaceBack<QSharedPointer<QtMWidgets::NavigationItem>const&>
              ((QList<QSharedPointer<QtMWidgets::NavigationItem>> *)&pTVar1->children,&item);
    pQVar4 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                       (&((this->d).d)->itemsMap,&widget_local);
    QSharedPointer<QtMWidgets::NavigationItem>::operator=(pQVar4,&item);
    QSharedPointer<QtMWidgets::NavigationItem>::deref(item.d);
    QSharedPointer<QtMWidgets::NavigationItem>::deref(dd);
  }
  else {
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int
NavigationBar::addWidget( QWidget * parent, const QString & title,
	QWidget * widget )
{
	int index = -1;

	if( d->itemsMap.contains( parent ) )
	{
		index = d->stack->addWidget( widget );

		QSharedPointer< NavigationItem > pp = d->itemsMap[ parent ];

		QSharedPointer< NavigationItem > item( new NavigationItem );
		item->title = title;
		item->parent = pp.data();
		item->self = widget;

		pp->children.append( item );
		d->itemsMap[ widget ] = item;
	}

	return index;
}